

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O3

void Abc_RwrExpWithCut(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  Abc_RwrExpWithCut_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves,1)
  ;
  uVar6 = 0;
  Abc_RwrExpWithCut_rec
            ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vLeaves,0);
  iVar5 = vLeaves->nSize;
  uVar4 = 0;
  if (0 < iVar5) {
    lVar2 = 0;
    uVar4 = 0;
    uVar6 = 0;
    do {
      uVar3 = (ulong)vLeaves->pArray[lVar2] & 0xfffffffffffffffe;
      uVar1 = *(uint *)(uVar3 + 0x14);
      uVar6 = uVar6 + ((uVar1 >> 4 & 1) != 0);
      uVar4 = (ulong)((int)uVar4 + (uint)((uVar1 >> 5 & 1) != 0));
      *(uint *)(uVar3 + 0x14) = uVar1 & 0xffffffcf;
      lVar2 = lVar2 + 1;
      iVar5 = vLeaves->nSize;
    } while (lVar2 < iVar5);
  }
  printf("(%d,%d:%d) ",(ulong)uVar6,uVar4,(ulong)(((int)uVar4 + uVar6) - iVar5));
  return;
}

Assistant:

void Abc_RwrExpWithCut( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves )
{
    Abc_Obj_t * pObj;
    int i, CountA, CountB;
    Abc_RwrExpWithCut_rec( Abc_ObjFanin0(pNode), vLeaves, 1 );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin1(pNode), vLeaves, 0 );
    CountA = CountB = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
    {
        CountA += Abc_ObjRegular(pObj)->fMarkA;
        CountB += Abc_ObjRegular(pObj)->fMarkB;
        Abc_ObjRegular(pObj)->fMarkA = 0;
        Abc_ObjRegular(pObj)->fMarkB = 0;
    }
    printf( "(%d,%d:%d) ", CountA, CountB, CountA+CountB-Vec_PtrSize(vLeaves) );
}